

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

void spvtools::opt::ReplacePhiParentWith(Instruction *inst,uint32_t orig_block,uint32_t new_block)

{
  uint32_t uVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_44;
  SmallVector<unsigned_int,_2UL> local_40;
  
  uVar1 = Instruction::GetSingleWordInOperand(inst,1);
  local_44 = new_block;
  if (uVar1 == orig_block) {
    init_list._M_len = 1;
    init_list._M_array = &local_44;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_40,init_list);
    uVar1 = 1;
  }
  else {
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_44;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_40,init_list_00);
    uVar1 = 3;
  }
  Instruction::SetInOperand(inst,uVar1,&local_40);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_40);
  return;
}

Assistant:

void ReplacePhiParentWith(Instruction* inst, uint32_t orig_block,
                          uint32_t new_block) {
  if (inst->GetSingleWordInOperand(1) == orig_block) {
    inst->SetInOperand(1, {new_block});
  } else {
    inst->SetInOperand(3, {new_block});
  }
}